

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calculator_target.hpp
# Opt level: O0

Result __thiscall
ruckig::TargetCalculator<1UL,_ruckig::StandardVector>::calculate<true>
          (TargetCalculator<1UL,_ruckig::StandardVector> *this,
          InputParameter<1UL,_ruckig::StandardVector> *inp,
          Trajectory<1UL,_ruckig::StandardVector> *traj,double delta_time,bool *was_interrupted)

{
  value_type_conflict3 vVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  value_type vVar11;
  double dVar12;
  Direction limiting_direction;
  undefined8 uVar13;
  byte bVar14;
  bool bVar15;
  __optional_eq_t<unsigned_long,_unsigned_long> _Var16;
  uint uVar17;
  reference pvVar18;
  Block *this_00;
  const_reference pvVar19;
  reference pvVar20;
  array<double,_1UL> *paVar21;
  array<ruckig::ControlInterface,_1UL> *this_01;
  const_reference pvVar22;
  reference pvVar23;
  array<ruckig::Synchronization,_1UL> *this_02;
  const_reference pvVar24;
  reference pvVar25;
  const_reference pvVar26;
  reference pvVar27;
  reference pvVar28;
  reference pvVar29;
  reference pvVar30;
  reference pvVar31;
  RuckigError *pRVar32;
  reference pvVar33;
  reference pvVar34;
  iterator pvVar35;
  iterator pvVar36;
  unsigned_long *puVar37;
  Interval *pIVar38;
  Vector<double> *pVVar39;
  StandardVector<Block,_1UL> *this_03;
  optional<ruckig::Block::Interval> *poVar40;
  double dVar41;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double extraout_XMM0_Qa_03;
  optional<double> t_min;
  byte local_26b9;
  bool local_2489;
  value_type local_2244;
  value_type local_223c;
  value_type_conflict3 local_2230;
  value_type_conflict3 local_2220;
  string local_2208;
  string local_21e8;
  string local_21c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_21a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2128;
  undefined1 local_2108 [8];
  VelocitySecondOrderStep2 step2_4;
  undefined1 local_20e8 [8];
  VelocityThirdOrderStep2 step2_3;
  undefined1 local_20a8 [8];
  PositionFirstOrderStep2 step2_2;
  undefined1 local_2088 [8];
  PositionSecondOrderStep2 step2_1;
  undefined1 local_2040 [8];
  PositionThirdOrderStep2 step2;
  byte local_1f29;
  bool found_time_synchronization_1;
  double t_profile_1;
  Profile *p_2;
  double dStack_1f10;
  bool skip_synchronization;
  size_t dof_5;
  double local_1f00;
  double t_profile;
  Profile *p_1;
  size_t dof_4;
  reference pvStack_1ee0;
  bool found_time_synchronization;
  Profile *p_limiting;
  double local_1ed0;
  size_t dof_3;
  _Storage<unsigned_long,_true> local_1ec0;
  double local_1eb8;
  size_t dof_2;
  string local_1ea8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e88;
  undefined1 local_1e61;
  string local_1e60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e40;
  double local_1e20;
  size_t dof_1;
  _Storage<double,_true> _Stack_1e10;
  bool has_zero_limits_1;
  undefined1 local_1e08;
  undefined7 uStack_1e07;
  undefined1 local_1df9;
  _Storage<unsigned_long,_true> _Stack_1df8;
  bool found_synchronization;
  optional<unsigned_long> limiting_dof;
  undefined1 local_1de0 [6];
  bool discrete_duration;
  string local_1dc0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1da0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d60;
  undefined1 local_1d39;
  string local_1d38;
  string local_1d08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1ce8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1cc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1ca8;
  bool local_1c81;
  undefined1 local_1c80 [7];
  bool has_zero_limits;
  VelocitySecondOrderStep1 step1_4;
  undefined1 local_1c68 [8];
  VelocityThirdOrderStep1 step1_3;
  undefined1 local_1578 [8];
  PositionFirstOrderStep1 step1_2;
  undefined1 local_1560 [8];
  PositionSecondOrderStep1 step1_1;
  undefined1 local_e68 [8];
  PositionThirdOrderStep1 step1;
  byte local_4b;
  bool found_profile;
  value_type *p;
  size_t dof;
  bool *was_interrupted_local;
  double delta_time_local;
  Trajectory<1UL,_ruckig::StandardVector> *traj_local;
  InputParameter<1UL,_ruckig::StandardVector> *inp_local;
  TargetCalculator<1UL,_ruckig::StandardVector> *this_local;
  
  *was_interrupted = false;
  Trajectory<1UL,_ruckig::StandardVector>::resize<1UL,_0>(traj,0);
  for (p = (value_type *)0x0; p < (value_type *)this->degrees_of_freedom;
      p = (value_type *)((long)(p->t)._M_elems + 1)) {
    pvVar18 = std::
              vector<std::array<ruckig::Profile,_1UL>,_std::allocator<std::array<ruckig::Profile,_1UL>_>_>
              ::operator[](&traj->profiles,0);
    this_00 = (Block *)std::array<ruckig::Profile,_1UL>::operator[](pvVar18,(size_type)p);
    bVar15 = std::optional::operator_cast_to_bool((optional *)&inp->min_velocity);
    if (bVar15) {
      paVar21 = std::optional<std::array<double,_1UL>_>::value(&inp->min_velocity);
      pvVar19 = std::array<double,_1UL>::operator[](paVar21,(size_type)p);
      local_2220 = *pvVar19;
    }
    else {
      pvVar19 = std::array<double,_1UL>::operator[](&inp->max_velocity,(size_type)p);
      local_2220 = -*pvVar19;
    }
    pvVar20 = std::array<double,_1UL>::operator[](&this->inp_min_velocity,(size_type)p);
    *pvVar20 = local_2220;
    bVar15 = std::optional::operator_cast_to_bool((optional *)&inp->min_acceleration);
    if (bVar15) {
      paVar21 = std::optional<std::array<double,_1UL>_>::value(&inp->min_acceleration);
      pvVar19 = std::array<double,_1UL>::operator[](paVar21,(size_type)p);
      local_2230 = *pvVar19;
    }
    else {
      pvVar19 = std::array<double,_1UL>::operator[](&inp->max_acceleration,(size_type)p);
      local_2230 = -*pvVar19;
    }
    pvVar20 = std::array<double,_1UL>::operator[](&this->inp_min_acceleration,(size_type)p);
    *pvVar20 = local_2230;
    bVar15 = std::optional::operator_cast_to_bool((optional *)&inp->per_dof_control_interface);
    if (bVar15) {
      this_01 = std::optional<std::array<ruckig::ControlInterface,_1UL>_>::value
                          (&inp->per_dof_control_interface);
      pvVar22 = std::array<ruckig::ControlInterface,_1UL>::operator[](this_01,(size_type)p);
      local_223c = *pvVar22;
    }
    else {
      local_223c = inp->control_interface;
    }
    pvVar23 = std::array<ruckig::ControlInterface,_1UL>::operator[]
                        (&this->inp_per_dof_control_interface,(size_type)p);
    *pvVar23 = local_223c;
    bVar15 = std::optional::operator_cast_to_bool((optional *)&inp->per_dof_synchronization);
    if (bVar15) {
      this_02 = std::optional<std::array<ruckig::Synchronization,_1UL>_>::value
                          (&inp->per_dof_synchronization);
      pvVar24 = std::array<ruckig::Synchronization,_1UL>::operator[](this_02,(size_type)p);
      local_2244 = *pvVar24;
    }
    else {
      local_2244 = inp->synchronization;
    }
    pvVar25 = std::array<ruckig::Synchronization,_1UL>::operator[]
                        (&this->inp_per_dof_synchronization,(size_type)p);
    *pvVar25 = local_2244;
    pvVar26 = std::array<bool,_1UL>::operator[](&inp->enabled,(size_type)p);
    if ((*pvVar26 & 1U) == 0) {
      pvVar19 = std::array<double,_1UL>::operator[](&inp->current_position,(size_type)p);
      vVar1 = *pvVar19;
      pvVar27 = std::array<double,_8UL>::back(&(this_00->p_min).p);
      *pvVar27 = vVar1;
      pvVar19 = std::array<double,_1UL>::operator[](&inp->current_velocity,(size_type)p);
      vVar1 = *pvVar19;
      pvVar27 = std::array<double,_8UL>::back(&(this_00->p_min).v);
      *pvVar27 = vVar1;
      pvVar19 = std::array<double,_1UL>::operator[](&inp->current_acceleration,(size_type)p);
      vVar1 = *pvVar19;
      pvVar27 = std::array<double,_8UL>::back(&(this_00->p_min).a);
      *pvVar27 = vVar1;
      pvVar28 = std::array<double,_7UL>::back(&(this_00->p_min).t_sum);
      *pvVar28 = 0.0;
      pvVar29 = std::array<ruckig::Block,_1UL>::operator[](&this->blocks,(size_type)p);
      pvVar29->t_min = 0.0;
      pvVar29 = std::array<ruckig::Block,_1UL>::operator[](&this->blocks,(size_type)p);
      std::optional<ruckig::Block::Interval>::operator=(&pvVar29->a);
      pvVar29 = std::array<ruckig::Block,_1UL>::operator[](&this->blocks,(size_type)p);
      std::optional<ruckig::Block::Interval>::operator=(&pvVar29->b);
    }
    else {
      pvVar23 = std::array<ruckig::ControlInterface,_1UL>::operator[]
                          (&this->inp_per_dof_control_interface,(size_type)p);
      if (*pvVar23 == Position) {
        pvVar19 = std::array<double,_1UL>::operator[](&inp->max_jerk,(size_type)p);
        uVar17 = std::isinf(*pvVar19);
        if ((uVar17 & 1) == 0) {
          pvVar19 = std::array<double,_1UL>::operator[](&inp->current_velocity,(size_type)p);
          dVar41 = *pvVar19;
          pvVar19 = std::array<double,_1UL>::operator[](&inp->current_acceleration,(size_type)p);
          dVar6 = *pvVar19;
          pvVar19 = std::array<double,_1UL>::operator[](&inp->max_velocity,(size_type)p);
          dVar7 = *pvVar19;
          pvVar20 = std::array<double,_1UL>::operator[](&this->inp_min_velocity,(size_type)p);
          dVar8 = *pvVar20;
          pvVar19 = std::array<double,_1UL>::operator[](&inp->max_acceleration,(size_type)p);
          dVar9 = *pvVar19;
          pvVar20 = std::array<double,_1UL>::operator[](&this->inp_min_acceleration,(size_type)p);
          dVar10 = *pvVar20;
          pvVar19 = std::array<double,_1UL>::operator[](&inp->max_jerk,(size_type)p);
          ruckig::BrakeProfile::get_position_brake_trajectory
                    (dVar41,dVar6,dVar7,dVar8,dVar9,dVar10,*pvVar19);
        }
        else {
          pvVar19 = std::array<double,_1UL>::operator[](&inp->max_acceleration,(size_type)p);
          uVar17 = std::isinf(*pvVar19);
          if ((uVar17 & 1) == 0) {
            pvVar19 = std::array<double,_1UL>::operator[](&inp->current_velocity,(size_type)p);
            dVar41 = *pvVar19;
            pvVar19 = std::array<double,_1UL>::operator[](&inp->max_velocity,(size_type)p);
            dVar6 = *pvVar19;
            pvVar20 = std::array<double,_1UL>::operator[](&this->inp_min_velocity,(size_type)p);
            dVar7 = *pvVar20;
            pvVar19 = std::array<double,_1UL>::operator[](&inp->max_acceleration,(size_type)p);
            dVar8 = *pvVar19;
            pvVar20 = std::array<double,_1UL>::operator[](&this->inp_min_acceleration,(size_type)p);
            ruckig::BrakeProfile::get_second_order_position_brake_trajectory
                      (dVar41,dVar6,dVar7,dVar8,*pvVar20);
          }
        }
        pvVar19 = std::array<double,_1UL>::operator[](&inp->current_position,(size_type)p);
        dVar41 = *pvVar19;
        pvVar19 = std::array<double,_1UL>::operator[](&inp->current_velocity,(size_type)p);
        dVar6 = *pvVar19;
        pvVar19 = std::array<double,_1UL>::operator[](&inp->current_acceleration,(size_type)p);
        dVar7 = *pvVar19;
        pvVar19 = std::array<double,_1UL>::operator[](&inp->target_position,(size_type)p);
        dVar8 = *pvVar19;
        pvVar19 = std::array<double,_1UL>::operator[](&inp->target_velocity,(size_type)p);
        dVar9 = *pvVar19;
        pvVar19 = std::array<double,_1UL>::operator[](&inp->target_acceleration,(size_type)p);
        Profile::set_boundary((Profile *)this_00,dVar41,dVar6,dVar7,dVar8,dVar9,*pvVar19);
      }
      else if (*pvVar23 == Velocity) {
        pvVar19 = std::array<double,_1UL>::operator[](&inp->max_jerk,(size_type)p);
        uVar17 = std::isinf(*pvVar19);
        if ((uVar17 & 1) == 0) {
          pvVar19 = std::array<double,_1UL>::operator[](&inp->current_acceleration,(size_type)p);
          dVar41 = *pvVar19;
          pvVar19 = std::array<double,_1UL>::operator[](&inp->max_acceleration,(size_type)p);
          dVar6 = *pvVar19;
          pvVar20 = std::array<double,_1UL>::operator[](&this->inp_min_acceleration,(size_type)p);
          dVar7 = *pvVar20;
          pvVar19 = std::array<double,_1UL>::operator[](&inp->max_jerk,(size_type)p);
          ruckig::BrakeProfile::get_velocity_brake_trajectory(dVar41,dVar6,dVar7,*pvVar19);
        }
        else {
          ruckig::BrakeProfile::get_second_order_velocity_brake_trajectory();
        }
        pvVar19 = std::array<double,_1UL>::operator[](&inp->current_position,(size_type)p);
        dVar41 = *pvVar19;
        pvVar19 = std::array<double,_1UL>::operator[](&inp->current_velocity,(size_type)p);
        dVar6 = *pvVar19;
        pvVar19 = std::array<double,_1UL>::operator[](&inp->current_acceleration,(size_type)p);
        dVar7 = *pvVar19;
        pvVar19 = std::array<double,_1UL>::operator[](&inp->target_velocity,(size_type)p);
        dVar8 = *pvVar19;
        pvVar19 = std::array<double,_1UL>::operator[](&inp->target_acceleration,(size_type)p);
        Profile::set_boundary_for_velocity((Profile *)this_00,dVar41,dVar6,dVar7,dVar8,*pvVar19);
      }
      pvVar19 = std::array<double,_1UL>::operator[](&inp->max_jerk,(size_type)p);
      uVar17 = std::isinf(*pvVar19);
      if ((uVar17 & 1) == 0) {
        pvVar27 = std::array<double,_8UL>::operator[](&(this_00->p_min).p,0);
        pvVar30 = std::array<double,_8UL>::operator[](&(this_00->p_min).v,0);
        pvVar31 = std::array<double,_8UL>::operator[](&(this_00->p_min).a,0);
        BrakeProfile::finalize(&(this_00->p_min).brake,pvVar27,pvVar30,pvVar31);
      }
      else {
        pvVar19 = std::array<double,_1UL>::operator[](&inp->max_acceleration,(size_type)p);
        uVar17 = std::isinf(*pvVar19);
        if ((uVar17 & 1) == 0) {
          pvVar27 = std::array<double,_8UL>::operator[](&(this_00->p_min).p,0);
          pvVar30 = std::array<double,_8UL>::operator[](&(this_00->p_min).v,0);
          pvVar31 = std::array<double,_8UL>::operator[](&(this_00->p_min).a,0);
          BrakeProfile::finalize_second_order(&(this_00->p_min).brake,pvVar27,pvVar30,pvVar31);
        }
      }
      local_4b = 0;
      pvVar23 = std::array<ruckig::ControlInterface,_1UL>::operator[]
                          (&this->inp_per_dof_control_interface,(size_type)p);
      if (*pvVar23 == Position) {
        pvVar19 = std::array<double,_1UL>::operator[](&inp->max_jerk,(size_type)p);
        uVar17 = std::isinf(*pvVar19);
        if ((uVar17 & 1) == 0) {
          pvVar27 = std::array<double,_8UL>::operator[](&(this_00->p_min).p,0);
          dVar41 = *pvVar27;
          pvVar27 = std::array<double,_8UL>::operator[](&(this_00->p_min).v,0);
          dVar6 = *pvVar27;
          pvVar27 = std::array<double,_8UL>::operator[](&(this_00->p_min).a,0);
          dVar7 = *pvVar27;
          dVar8 = (this_00->p_min).pf;
          dVar9 = (this_00->p_min).vf;
          dVar10 = (this_00->p_min).af;
          pvVar19 = std::array<double,_1UL>::operator[](&inp->max_velocity,(size_type)p);
          dVar2 = *pvVar19;
          pvVar20 = std::array<double,_1UL>::operator[](&this->inp_min_velocity,(size_type)p);
          dVar3 = *pvVar20;
          pvVar19 = std::array<double,_1UL>::operator[](&inp->max_acceleration,(size_type)p);
          dVar4 = *pvVar19;
          pvVar20 = std::array<double,_1UL>::operator[](&this->inp_min_acceleration,(size_type)p);
          dVar5 = *pvVar20;
          pvVar19 = std::array<double,_1UL>::operator[](&inp->max_jerk,(size_type)p);
          ruckig::PositionThirdOrderStep1::PositionThirdOrderStep1
                    ((PositionThirdOrderStep1 *)local_e68,dVar41,dVar6,dVar7,dVar8,dVar9,dVar10,
                     dVar2,dVar3,dVar4,dVar5,*pvVar19);
          std::array<ruckig::Block,_1UL>::operator[](&this->blocks,(size_type)p);
          local_4b = ruckig::PositionThirdOrderStep1::get_profile((Profile *)local_e68,this_00);
        }
        else {
          pvVar19 = std::array<double,_1UL>::operator[](&inp->max_acceleration,(size_type)p);
          uVar17 = std::isinf(*pvVar19);
          if ((uVar17 & 1) == 0) {
            pvVar27 = std::array<double,_8UL>::operator[](&(this_00->p_min).p,0);
            dVar41 = *pvVar27;
            pvVar27 = std::array<double,_8UL>::operator[](&(this_00->p_min).v,0);
            dVar6 = *pvVar27;
            dVar7 = (this_00->p_min).pf;
            dVar8 = (this_00->p_min).vf;
            pvVar19 = std::array<double,_1UL>::operator[](&inp->max_velocity,(size_type)p);
            dVar9 = *pvVar19;
            pvVar20 = std::array<double,_1UL>::operator[](&this->inp_min_velocity,(size_type)p);
            dVar10 = *pvVar20;
            pvVar19 = std::array<double,_1UL>::operator[](&inp->max_acceleration,(size_type)p);
            dVar2 = *pvVar19;
            pvVar20 = std::array<double,_1UL>::operator[](&this->inp_min_acceleration,(size_type)p);
            ruckig::PositionSecondOrderStep1::PositionSecondOrderStep1
                      ((PositionSecondOrderStep1 *)local_1560,dVar41,dVar6,dVar7,dVar8,dVar9,dVar10,
                       dVar2,*pvVar20);
            std::array<ruckig::Block,_1UL>::operator[](&this->blocks,(size_type)p);
            local_4b = ruckig::PositionSecondOrderStep1::get_profile((Profile *)local_1560,this_00);
          }
          else {
            pvVar27 = std::array<double,_8UL>::operator[](&(this_00->p_min).p,0);
            dVar41 = *pvVar27;
            dVar6 = (this_00->p_min).pf;
            pvVar19 = std::array<double,_1UL>::operator[](&inp->max_velocity,(size_type)p);
            dVar7 = *pvVar19;
            pvVar20 = std::array<double,_1UL>::operator[](&this->inp_min_velocity,(size_type)p);
            ruckig::PositionFirstOrderStep1::PositionFirstOrderStep1
                      ((PositionFirstOrderStep1 *)local_1578,dVar41,dVar6,dVar7,*pvVar20);
            std::array<ruckig::Block,_1UL>::operator[](&this->blocks,(size_type)p);
            local_4b = ruckig::PositionFirstOrderStep1::get_profile((Profile *)local_1578,this_00);
          }
        }
        local_4b = local_4b & 1;
      }
      else if (*pvVar23 == Velocity) {
        pvVar19 = std::array<double,_1UL>::operator[](&inp->max_jerk,(size_type)p);
        uVar17 = std::isinf(*pvVar19);
        if ((uVar17 & 1) == 0) {
          pvVar27 = std::array<double,_8UL>::operator[](&(this_00->p_min).v,0);
          dVar41 = *pvVar27;
          pvVar27 = std::array<double,_8UL>::operator[](&(this_00->p_min).a,0);
          dVar6 = *pvVar27;
          dVar7 = (this_00->p_min).vf;
          dVar8 = (this_00->p_min).af;
          pvVar19 = std::array<double,_1UL>::operator[](&inp->max_acceleration,(size_type)p);
          dVar9 = *pvVar19;
          pvVar20 = std::array<double,_1UL>::operator[](&this->inp_min_acceleration,(size_type)p);
          dVar10 = *pvVar20;
          pvVar19 = std::array<double,_1UL>::operator[](&inp->max_jerk,(size_type)p);
          ruckig::VelocityThirdOrderStep1::VelocityThirdOrderStep1
                    ((VelocityThirdOrderStep1 *)local_1c68,dVar41,dVar6,dVar7,dVar8,dVar9,dVar10,
                     *pvVar19);
          std::array<ruckig::Block,_1UL>::operator[](&this->blocks,(size_type)p);
          local_4b = ruckig::VelocityThirdOrderStep1::get_profile((Profile *)local_1c68,this_00);
        }
        else {
          pvVar27 = std::array<double,_8UL>::operator[](&(this_00->p_min).v,0);
          dVar41 = *pvVar27;
          dVar6 = (this_00->p_min).vf;
          pvVar19 = std::array<double,_1UL>::operator[](&inp->max_acceleration,(size_type)p);
          dVar7 = *pvVar19;
          pvVar20 = std::array<double,_1UL>::operator[](&this->inp_min_acceleration,(size_type)p);
          ruckig::VelocitySecondOrderStep1::VelocitySecondOrderStep1
                    ((VelocitySecondOrderStep1 *)local_1c80,dVar41,dVar6,dVar7,*pvVar20);
          std::array<ruckig::Block,_1UL>::operator[](&this->blocks,(size_type)p);
          local_4b = ruckig::VelocitySecondOrderStep1::get_profile((Profile *)local_1c80,this_00);
        }
        local_4b = local_4b & 1;
      }
      if (local_4b == 0) {
        pvVar19 = std::array<double,_1UL>::operator[](&inp->max_acceleration,(size_type)p);
        local_2489 = true;
        if ((*pvVar19 != 0.0) || (NAN(*pvVar19))) {
          pvVar20 = std::array<double,_1UL>::operator[](&this->inp_min_acceleration,(size_type)p);
          local_2489 = true;
          if ((*pvVar20 != 0.0) || (NAN(*pvVar20))) {
            pvVar19 = std::array<double,_1UL>::operator[](&inp->max_jerk,(size_type)p);
            local_2489 = *pvVar19 == 0.0;
          }
        }
        local_1c81 = local_2489;
        if (local_2489 != false) {
          local_1d39 = 1;
          pRVar32 = (RuckigError *)__cxa_allocate_exception(0x10);
          std::__cxx11::to_string(&local_1d08,(unsigned_long)p);
          std::operator+(&local_1ce8,"zero limits conflict in step 1, dof: ",&local_1d08);
          std::operator+(&local_1cc8,&local_1ce8," input: ");
          InputParameter<1ul,ruckig::StandardVector>::to_string_abi_cxx11_(&local_1d38,inp);
          std::operator+(&local_1ca8,&local_1cc8,&local_1d38);
          RuckigError::RuckigError(pRVar32,&local_1ca8);
          local_1d39 = 0;
          __cxa_throw(pRVar32,&RuckigError::typeinfo,RuckigError::~RuckigError);
        }
        limiting_dof.super__Optional_base<unsigned_long,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_long>._15_1_ = 1;
        pRVar32 = (RuckigError *)__cxa_allocate_exception(0x10);
        std::__cxx11::to_string(&local_1dc0,(unsigned_long)p);
        std::operator+(&local_1da0,"error in step 1, dof: ",&local_1dc0);
        std::operator+(&local_1d80,&local_1da0," input: ");
        InputParameter<1ul,ruckig::StandardVector>::to_string_abi_cxx11_((string *)local_1de0,inp);
        std::operator+(&local_1d60,&local_1d80,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1de0);
        RuckigError::RuckigError(pRVar32,&local_1d60);
        limiting_dof.super__Optional_base<unsigned_long,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_long>._15_1_ = 0;
        __cxa_throw(pRVar32,&RuckigError::typeinfo,RuckigError::~RuckigError);
      }
      pvVar29 = std::array<ruckig::Block,_1UL>::operator[](&this->blocks,(size_type)p);
      dVar41 = pvVar29->t_min;
      pvVar20 = std::array<double,_1UL>::operator[](&traj->independent_min_durations,(size_type)p);
      *pvVar20 = dVar41;
    }
  }
  limiting_dof.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._14_1_ = inp->duration_discretization == Discrete;
  if (((this->degrees_of_freedom != 1) ||
      (bVar15 = std::optional::operator_cast_to_bool((optional *)&inp->minimum_duration), bVar15))
     || ((limiting_dof.super__Optional_base<unsigned_long,_true,_true>._M_payload.
          super__Optional_payload_base<unsigned_long>._14_1_ & 1) != 0)) {
    std::optional<unsigned_long>::optional((optional<unsigned_long> *)&stack0xffffffffffffe208);
    _Stack_1e10 = (inp->minimum_duration).super__Optional_base<double,_true,_true>._M_payload.
                  super__Optional_payload_base<double>._M_payload;
    uVar13 = *(undefined8 *)
              &(inp->minimum_duration).super__Optional_base<double,_true,_true>._M_payload.
               super__Optional_payload_base<double>._M_engaged;
    local_1e08 = (undefined1)uVar13;
    uStack_1e07 = (undefined7)((ulong)uVar13 >> 8);
    pvVar18 = std::
              vector<std::array<ruckig::Profile,_1UL>,_std::allocator<std::array<ruckig::Profile,_1UL>_>_>
              ::operator[](&traj->profiles,0);
    t_min.super__Optional_base<double,_true,_true>._M_payload.super__Optional_payload_base<double>.
    _M_engaged = (bool)local_1e08;
    t_min.super__Optional_base<double,_true,_true>._M_payload.super__Optional_payload_base<double>.
    _M_payload = _Stack_1e10;
    t_min.super__Optional_base<double,_true,_true>._M_payload.super__Optional_payload_base<double>.
    _9_7_ = 0;
    local_1df9 = synchronize(this,t_min,&traj->duration,
                             (optional<unsigned_long> *)&stack0xffffffffffffe208,pvVar18,
                             (bool)(limiting_dof.super__Optional_base<unsigned_long,_true,_true>.
                                    _M_payload.super__Optional_payload_base<unsigned_long>._14_1_ &
                                   1),delta_time);
    if (!(bool)local_1df9) {
      dof_1._7_1_ = 0;
      local_1e20 = 0.0;
      do {
        if (this->degrees_of_freedom <= (ulong)local_1e20) {
LAB_001bb018:
          if ((dof_1._7_1_ & 1) != 0) {
            local_1e61 = 1;
            pRVar32 = (RuckigError *)__cxa_allocate_exception(0x10);
            std::__cxx11::to_string(&local_1e60,traj->duration);
            std::operator+(&local_1e40,
                           "zero limits conflict with other degrees of freedom in time synchronization "
                           ,&local_1e60);
            RuckigError::RuckigError(pRVar32,&local_1e40);
            local_1e61 = 0;
            __cxa_throw(pRVar32,&RuckigError::typeinfo,RuckigError::~RuckigError);
          }
          dof_2._7_1_ = 1;
          pRVar32 = (RuckigError *)__cxa_allocate_exception(0x10);
          std::__cxx11::to_string(&local_1ea8,traj->duration);
          std::operator+(&local_1e88,"error in time synchronization: ",&local_1ea8);
          RuckigError::RuckigError(pRVar32,&local_1e88);
          dof_2._7_1_ = 0;
          __cxa_throw(pRVar32,&RuckigError::typeinfo,RuckigError::~RuckigError);
        }
        pvVar19 = std::array<double,_1UL>::operator[](&inp->max_acceleration,(size_type)local_1e20);
        if ((*pvVar19 == 0.0) && (!NAN(*pvVar19))) {
LAB_001baff6:
          dof_1._7_1_ = 1;
          goto LAB_001bb018;
        }
        pvVar20 = std::array<double,_1UL>::operator[]
                            (&this->inp_min_acceleration,(size_type)local_1e20);
        if ((*pvVar20 == 0.0) && (!NAN(*pvVar20))) goto LAB_001baff6;
        pvVar19 = std::array<double,_1UL>::operator[](&inp->max_jerk,(size_type)local_1e20);
        if ((*pvVar19 == 0.0) && (!NAN(*pvVar19))) goto LAB_001baff6;
        local_1e20 = (double)((long)local_1e20 + 1);
      } while( true );
    }
    for (local_1eb8 = 0.0; (ulong)local_1eb8 < this->degrees_of_freedom;
        local_1eb8 = (double)((long)local_1eb8 + 1)) {
      pvVar26 = std::array<bool,_1UL>::operator[](&inp->enabled,(size_type)local_1eb8);
      if (((*pvVar26 & 1U) != 0) &&
         (pvVar25 = std::array<ruckig::Synchronization,_1UL>::operator[]
                              (&this->inp_per_dof_synchronization,(size_type)local_1eb8),
         *pvVar25 == None)) {
        pvVar29 = std::array<ruckig::Block,_1UL>::operator[](&this->blocks,(size_type)local_1eb8);
        pvVar18 = std::
                  vector<std::array<ruckig::Profile,_1UL>,_std::allocator<std::array<ruckig::Profile,_1UL>_>_>
                  ::operator[](&traj->profiles,0);
        pvVar33 = std::array<ruckig::Profile,_1UL>::operator[](pvVar18,(size_type)local_1eb8);
        memcpy(pvVar33,pvVar29,0x23c);
        pvVar29 = std::array<ruckig::Block,_1UL>::operator[](&this->blocks,(size_type)local_1eb8);
        if (traj->duration <= pvVar29->t_min && pvVar29->t_min != traj->duration) {
          pvVar29 = std::array<ruckig::Block,_1UL>::operator[](&this->blocks,(size_type)local_1eb8);
          traj->duration = pvVar29->t_min;
          std::optional<unsigned_long>::optional<unsigned_long_&,_true>
                    ((optional<unsigned_long> *)&dof_3,(unsigned_long *)&local_1eb8);
          _Stack_1df8._M_value = dof_3;
          limiting_dof.super__Optional_base<unsigned_long,_true,_true>._M_payload.
          super__Optional_payload_base<unsigned_long>._M_payload = local_1ec0;
        }
      }
    }
    vVar11 = traj->duration;
    pvVar34 = std::vector<double,_std::allocator<double>_>::operator[](&traj->cumulative_times,0);
    *pvVar34 = vVar11;
    if (traj->duration <= 7600.0) {
      if ((traj->duration != 0.0) || (NAN(traj->duration))) {
        if ((limiting_dof.super__Optional_base<unsigned_long,_true,_true>._M_payload.
             super__Optional_payload_base<unsigned_long>._14_1_ & 1) == 0) {
          pvVar35 = std::array<ruckig::Synchronization,_1UL>::begin
                              (&this->inp_per_dof_synchronization);
          pvVar36 = std::array<ruckig::Synchronization,_1UL>::end
                              (&this->inp_per_dof_synchronization);
          bVar15 = std::
                   all_of<ruckig::Synchronization*,ruckig::TargetCalculator<1ul,ruckig::StandardVector>::calculate<true>(ruckig::InputParameter<1ul,ruckig::StandardVector>const&,ruckig::Trajectory<1ul,ruckig::StandardVector>&,double,bool&)::_lambda(ruckig::Synchronization)_1_>
                             (pvVar35,pvVar36);
          if (bVar15) {
            return Working;
          }
        }
        bVar15 = std::optional::operator_cast_to_bool((optional *)&stack0xffffffffffffe208);
        if (bVar15) {
          pvVar35 = std::array<ruckig::Synchronization,_1UL>::begin
                              (&this->inp_per_dof_synchronization);
          pvVar36 = std::array<ruckig::Synchronization,_1UL>::end
                              (&this->inp_per_dof_synchronization);
          bVar15 = std::
                   any_of<ruckig::Synchronization*,ruckig::TargetCalculator<1ul,ruckig::StandardVector>::calculate<true>(ruckig::InputParameter<1ul,ruckig::StandardVector>const&,ruckig::Trajectory<1ul,ruckig::StandardVector>&,double,bool&)::_lambda(ruckig::Synchronization)_2_>
                             (pvVar35,pvVar36);
          if (bVar15) {
            pvVar18 = std::
                      vector<std::array<ruckig::Profile,_1UL>,_std::allocator<std::array<ruckig::Profile,_1UL>_>_>
                      ::operator[](&traj->profiles,0);
            puVar37 = std::optional<unsigned_long>::value
                                ((optional<unsigned_long> *)&stack0xffffffffffffe208);
            pvStack_1ee0 = std::array<ruckig::Profile,_1UL>::operator[](pvVar18,*puVar37);
            limiting_direction = pvStack_1ee0->direction;
            puVar37 = std::optional<unsigned_long>::value
                                ((optional<unsigned_long> *)&stack0xffffffffffffe208);
            bVar15 = is_input_collinear(this,inp,limiting_direction,*puVar37);
            if (bVar15) {
              dof_4._7_1_ = 1;
              for (p_1 = (Profile *)0x0; p_1 < (Profile *)this->degrees_of_freedom;
                  p_1 = (Profile *)((long)(p_1->t)._M_elems + 1)) {
                pvVar26 = std::array<bool,_1UL>::operator[](&inp->enabled,(size_type)p_1);
                if ((((*pvVar26 & 1U) != 0) &&
                    (_Var16 = std::operator==((unsigned_long *)&p_1,
                                              (optional<unsigned_long> *)&stack0xffffffffffffe208),
                    !_Var16)) &&
                   (pvVar25 = std::array<ruckig::Synchronization,_1UL>::operator[]
                                        (&this->inp_per_dof_synchronization,(size_type)p_1),
                   *pvVar25 == Phase)) {
                  pvVar18 = std::
                            vector<std::array<ruckig::Profile,_1UL>,_std::allocator<std::array<ruckig::Profile,_1UL>_>_>
                            ::operator[](&traj->profiles,0);
                  t_profile = (double)std::array<ruckig::Profile,_1UL>::operator[]
                                                (pvVar18,(size_type)p_1);
                  local_1f00 = (traj->duration - (((reference)t_profile)->brake).duration) -
                               (((reference)t_profile)->accel).duration;
                  (((reference)t_profile)->t)._M_elems[6] = (pvStack_1ee0->t)._M_elems[6];
                  dVar41 = (pvStack_1ee0->t)._M_elems[0];
                  dVar6 = (pvStack_1ee0->t)._M_elems[1];
                  dVar7 = (pvStack_1ee0->t)._M_elems[2];
                  dVar8 = (pvStack_1ee0->t)._M_elems[3];
                  dVar9 = (pvStack_1ee0->t)._M_elems[5];
                  (((reference)t_profile)->t)._M_elems[4] = (pvStack_1ee0->t)._M_elems[4];
                  (((reference)t_profile)->t)._M_elems[5] = dVar9;
                  (((reference)t_profile)->t)._M_elems[2] = dVar7;
                  (((reference)t_profile)->t)._M_elems[3] = dVar8;
                  (((reference)t_profile)->t)._M_elems[0] = dVar41;
                  (((reference)t_profile)->t)._M_elems[1] = dVar6;
                  ((reference)t_profile)->control_signs = pvStack_1ee0->control_signs;
                  pvVar23 = std::array<ruckig::ControlInterface,_1UL>::operator[]
                                      (&this->inp_per_dof_control_interface,(size_type)p_1);
                  if (*pvVar23 == Position) {
                    if (*(int *)((long)t_profile + 0x238) == 0) {
                      pvVar19 = std::array<double,_1UL>::operator[](&inp->max_jerk,(size_type)p_1);
                      uVar17 = std::isinf(*pvVar19);
                      dVar6 = t_profile;
                      dVar41 = local_1f00;
                      if ((uVar17 & 1) == 0) {
                        pvVar20 = std::array<double,_1UL>::operator[]
                                            (&this->new_phase_control,(size_type)p_1);
                        dVar7 = *pvVar20;
                        pvVar19 = std::array<double,_1UL>::operator[]
                                            (&inp->max_velocity,(size_type)p_1);
                        dVar8 = *pvVar19;
                        pvVar20 = std::array<double,_1UL>::operator[]
                                            (&this->inp_min_velocity,(size_type)p_1);
                        dVar9 = *pvVar20;
                        pvVar19 = std::array<double,_1UL>::operator[]
                                            (&inp->max_acceleration,(size_type)p_1);
                        dVar10 = *pvVar19;
                        pvVar20 = std::array<double,_1UL>::operator[]
                                            (&this->inp_min_acceleration,(size_type)p_1);
                        dVar2 = *pvVar20;
                        pvVar19 = std::array<double,_1UL>::operator[](&inp->max_jerk,(size_type)p_1)
                        ;
                        bVar15 = Profile::
                                 check_with_timing<(ruckig::Profile::ControlSigns)0,(ruckig::Profile::ReachedLimits)7>
                                           ((Profile *)dVar6,dVar41,dVar7,dVar8,dVar9,dVar10,dVar2,
                                            *pvVar19);
                        bVar14 = dof_4._7_1_ & 1 & bVar15;
                      }
                      else {
                        pvVar19 = std::array<double,_1UL>::operator[]
                                            (&inp->max_acceleration,(size_type)p_1);
                        uVar17 = std::isinf(*pvVar19);
                        dVar6 = t_profile;
                        dVar41 = local_1f00;
                        if ((uVar17 & 1) == 0) {
                          pvVar20 = std::array<double,_1UL>::operator[]
                                              (&this->new_phase_control,(size_type)p_1);
                          dVar7 = *pvVar20;
                          pvVar20 = std::array<double,_1UL>::operator[]
                                              (&this->new_phase_control,(size_type)p_1);
                          vVar1 = *pvVar20;
                          pvVar19 = std::array<double,_1UL>::operator[]
                                              (&inp->max_velocity,(size_type)p_1);
                          dVar8 = *pvVar19;
                          pvVar20 = std::array<double,_1UL>::operator[]
                                              (&this->inp_min_velocity,(size_type)p_1);
                          dVar9 = *pvVar20;
                          pvVar19 = std::array<double,_1UL>::operator[]
                                              (&inp->max_acceleration,(size_type)p_1);
                          dVar10 = *pvVar19;
                          pvVar20 = std::array<double,_1UL>::operator[]
                                              (&this->inp_min_acceleration,(size_type)p_1);
                          bVar15 = Profile::
                                   check_for_second_order_with_timing<(ruckig::Profile::ControlSigns)0,(ruckig::Profile::ReachedLimits)7>
                                             ((Profile *)dVar6,dVar41,dVar7,-vVar1,dVar8,dVar9,
                                              dVar10,*pvVar20);
                          bVar14 = dof_4._7_1_ & 1 & bVar15;
                        }
                        else {
                          pvVar20 = std::array<double,_1UL>::operator[]
                                              (&this->new_phase_control,(size_type)p_1);
                          dVar7 = *pvVar20;
                          pvVar19 = std::array<double,_1UL>::operator[]
                                              (&inp->max_velocity,(size_type)p_1);
                          dVar8 = *pvVar19;
                          pvVar20 = std::array<double,_1UL>::operator[]
                                              (&this->inp_min_velocity,(size_type)p_1);
                          bVar15 = Profile::
                                   check_for_first_order_with_timing<(ruckig::Profile::ControlSigns)0,(ruckig::Profile::ReachedLimits)7>
                                             ((Profile *)dVar6,dVar41,dVar7,dVar8,*pvVar20);
                          bVar14 = dof_4._7_1_ & 1 & bVar15;
                        }
                      }
                      dof_4._7_1_ = bVar14 != 0;
                    }
                    else if (*(int *)((long)t_profile + 0x238) == 1) {
                      pvVar19 = std::array<double,_1UL>::operator[](&inp->max_jerk,(size_type)p_1);
                      uVar17 = std::isinf(*pvVar19);
                      dVar6 = t_profile;
                      dVar41 = local_1f00;
                      if ((uVar17 & 1) == 0) {
                        pvVar20 = std::array<double,_1UL>::operator[]
                                            (&this->new_phase_control,(size_type)p_1);
                        dVar7 = *pvVar20;
                        pvVar19 = std::array<double,_1UL>::operator[]
                                            (&inp->max_velocity,(size_type)p_1);
                        dVar8 = *pvVar19;
                        pvVar20 = std::array<double,_1UL>::operator[]
                                            (&this->inp_min_velocity,(size_type)p_1);
                        dVar9 = *pvVar20;
                        pvVar19 = std::array<double,_1UL>::operator[]
                                            (&inp->max_acceleration,(size_type)p_1);
                        dVar10 = *pvVar19;
                        pvVar20 = std::array<double,_1UL>::operator[]
                                            (&this->inp_min_acceleration,(size_type)p_1);
                        dVar2 = *pvVar20;
                        pvVar19 = std::array<double,_1UL>::operator[](&inp->max_jerk,(size_type)p_1)
                        ;
                        bVar15 = Profile::
                                 check_with_timing<(ruckig::Profile::ControlSigns)1,(ruckig::Profile::ReachedLimits)7>
                                           ((Profile *)dVar6,dVar41,dVar7,dVar8,dVar9,dVar10,dVar2,
                                            *pvVar19);
                        bVar14 = dof_4._7_1_ & 1 & bVar15;
                      }
                      else {
                        pvVar20 = std::array<double,_1UL>::operator[]
                                            (&this->new_phase_control,(size_type)p_1);
                        dVar7 = *pvVar20;
                        pvVar20 = std::array<double,_1UL>::operator[]
                                            (&this->new_phase_control,(size_type)p_1);
                        vVar1 = *pvVar20;
                        pvVar19 = std::array<double,_1UL>::operator[]
                                            (&inp->max_velocity,(size_type)p_1);
                        dVar8 = *pvVar19;
                        pvVar20 = std::array<double,_1UL>::operator[]
                                            (&this->inp_min_velocity,(size_type)p_1);
                        dVar9 = *pvVar20;
                        pvVar19 = std::array<double,_1UL>::operator[]
                                            (&inp->max_acceleration,(size_type)p_1);
                        dVar10 = *pvVar19;
                        pvVar20 = std::array<double,_1UL>::operator[]
                                            (&this->inp_min_acceleration,(size_type)p_1);
                        bVar15 = Profile::
                                 check_for_second_order_with_timing<(ruckig::Profile::ControlSigns)1,(ruckig::Profile::ReachedLimits)7>
                                           ((Profile *)dVar6,dVar41,dVar7,-vVar1,dVar8,dVar9,dVar10,
                                            *pvVar20);
                        bVar14 = dof_4._7_1_ & 1 & bVar15;
                      }
                      dof_4._7_1_ = bVar14 != 0;
                    }
                  }
                  else if (*pvVar23 == Velocity) {
                    if (*(int *)((long)t_profile + 0x238) == 0) {
                      pvVar19 = std::array<double,_1UL>::operator[](&inp->max_jerk,(size_type)p_1);
                      uVar17 = std::isinf(*pvVar19);
                      dVar6 = t_profile;
                      dVar41 = local_1f00;
                      if ((uVar17 & 1) == 0) {
                        pvVar20 = std::array<double,_1UL>::operator[]
                                            (&this->new_phase_control,(size_type)p_1);
                        dVar7 = *pvVar20;
                        pvVar19 = std::array<double,_1UL>::operator[]
                                            (&inp->max_acceleration,(size_type)p_1);
                        dVar8 = *pvVar19;
                        pvVar20 = std::array<double,_1UL>::operator[]
                                            (&this->inp_min_acceleration,(size_type)p_1);
                        dVar9 = *pvVar20;
                        pvVar19 = std::array<double,_1UL>::operator[](&inp->max_jerk,(size_type)p_1)
                        ;
                        bVar15 = Profile::
                                 check_for_velocity_with_timing<(ruckig::Profile::ControlSigns)0,(ruckig::Profile::ReachedLimits)7>
                                           ((Profile *)dVar6,dVar41,dVar7,dVar8,dVar9,*pvVar19);
                        bVar14 = dof_4._7_1_ & 1 & bVar15;
                      }
                      else {
                        pvVar20 = std::array<double,_1UL>::operator[]
                                            (&this->new_phase_control,(size_type)p_1);
                        dVar7 = *pvVar20;
                        pvVar19 = std::array<double,_1UL>::operator[]
                                            (&inp->max_acceleration,(size_type)p_1);
                        dVar8 = *pvVar19;
                        pvVar20 = std::array<double,_1UL>::operator[]
                                            (&this->inp_min_acceleration,(size_type)p_1);
                        bVar15 = Profile::
                                 check_for_second_order_velocity_with_timing<(ruckig::Profile::ControlSigns)0,(ruckig::Profile::ReachedLimits)7>
                                           ((Profile *)dVar6,dVar41,dVar7,dVar8,*pvVar20);
                        bVar14 = dof_4._7_1_ & 1 & bVar15;
                      }
                      dof_4._7_1_ = bVar14 != 0;
                    }
                    else if (*(int *)((long)t_profile + 0x238) == 1) {
                      pvVar19 = std::array<double,_1UL>::operator[](&inp->max_jerk,(size_type)p_1);
                      uVar17 = std::isinf(*pvVar19);
                      dVar6 = t_profile;
                      dVar41 = local_1f00;
                      if ((uVar17 & 1) == 0) {
                        pvVar20 = std::array<double,_1UL>::operator[]
                                            (&this->new_phase_control,(size_type)p_1);
                        dVar7 = *pvVar20;
                        pvVar19 = std::array<double,_1UL>::operator[]
                                            (&inp->max_acceleration,(size_type)p_1);
                        dVar8 = *pvVar19;
                        pvVar20 = std::array<double,_1UL>::operator[]
                                            (&this->inp_min_acceleration,(size_type)p_1);
                        dVar9 = *pvVar20;
                        pvVar19 = std::array<double,_1UL>::operator[](&inp->max_jerk,(size_type)p_1)
                        ;
                        bVar15 = Profile::
                                 check_for_velocity_with_timing<(ruckig::Profile::ControlSigns)1,(ruckig::Profile::ReachedLimits)7>
                                           ((Profile *)dVar6,dVar41,dVar7,dVar8,dVar9,*pvVar19);
                        bVar14 = dof_4._7_1_ & 1 & bVar15;
                      }
                      else {
                        pvVar20 = std::array<double,_1UL>::operator[]
                                            (&this->new_phase_control,(size_type)p_1);
                        dVar7 = *pvVar20;
                        pvVar19 = std::array<double,_1UL>::operator[]
                                            (&inp->max_acceleration,(size_type)p_1);
                        dVar8 = *pvVar19;
                        pvVar20 = std::array<double,_1UL>::operator[]
                                            (&this->inp_min_acceleration,(size_type)p_1);
                        bVar15 = Profile::
                                 check_for_second_order_velocity_with_timing<(ruckig::Profile::ControlSigns)1,(ruckig::Profile::ReachedLimits)7>
                                           ((Profile *)dVar6,dVar41,dVar7,dVar8,*pvVar20);
                        bVar14 = dof_4._7_1_ & 1 & bVar15;
                      }
                      dof_4._7_1_ = bVar14 != 0;
                    }
                  }
                  *(ReachedLimits *)((long)t_profile + 0x230) = pvStack_1ee0->limits;
                }
              }
              if ((dof_4._7_1_ & 1) != 0) {
                pvVar35 = std::array<ruckig::Synchronization,_1UL>::begin
                                    (&this->inp_per_dof_synchronization);
                pvVar36 = std::array<ruckig::Synchronization,_1UL>::end
                                    (&this->inp_per_dof_synchronization);
                bVar15 = std::
                         all_of<ruckig::Synchronization*,ruckig::TargetCalculator<1ul,ruckig::StandardVector>::calculate<true>(ruckig::InputParameter<1ul,ruckig::StandardVector>const&,ruckig::Trajectory<1ul,ruckig::StandardVector>&,double,bool&)::_lambda(ruckig::Synchronization)_3_>
                                   (pvVar35,pvVar36);
                if (bVar15) {
                  return Working;
                }
              }
            }
          }
        }
        for (dStack_1f10 = 0.0; (ulong)dStack_1f10 < this->degrees_of_freedom;
            dStack_1f10 = (double)((long)dStack_1f10 + 1)) {
          _Var16 = std::operator==((unsigned_long *)&stack0xffffffffffffe0f0,
                                   (optional<unsigned_long> *)&stack0xffffffffffffe208);
          if (_Var16) {
LAB_001bc24d:
            local_26b9 = limiting_dof.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                         super__Optional_payload_base<unsigned_long>._14_1_ ^ 0xff;
          }
          else {
            pvVar25 = std::array<ruckig::Synchronization,_1UL>::operator[]
                                (&this->inp_per_dof_synchronization,(size_type)dStack_1f10);
            local_26b9 = 0;
            if (*pvVar25 == None) goto LAB_001bc24d;
          }
          pvVar26 = std::array<bool,_1UL>::operator[](&inp->enabled,(size_type)dStack_1f10);
          if (((*pvVar26 & 1U) != 0) && ((local_26b9 & 1) == 0)) {
            pvVar18 = std::
                      vector<std::array<ruckig::Profile,_1UL>,_std::allocator<std::array<ruckig::Profile,_1UL>_>_>
                      ::operator[](&traj->profiles,0);
            pvVar33 = std::array<ruckig::Profile,_1UL>::operator[](pvVar18,(size_type)dStack_1f10);
            dVar41 = (traj->duration - (pvVar33->brake).duration) - (pvVar33->accel).duration;
            pvVar25 = std::array<ruckig::Synchronization,_1UL>::operator[]
                                (&this->inp_per_dof_synchronization,(size_type)dStack_1f10);
            if (*pvVar25 == TimeIfNecessary) {
              pVVar39 = &inp->target_velocity;
              std::array<double,_1UL>::operator[](pVVar39,(size_type)dStack_1f10);
              std::abs((int)pVVar39);
              if (extraout_XMM0_Qa < 2.220446049250313e-16) {
                pVVar39 = &inp->target_acceleration;
                std::array<double,_1UL>::operator[](pVVar39,(size_type)dStack_1f10);
                std::abs((int)pVVar39);
                if (extraout_XMM0_Qa_00 < 2.220446049250313e-16) {
                  pvVar29 = std::array<ruckig::Block,_1UL>::operator[]
                                      (&this->blocks,(size_type)dStack_1f10);
                  memcpy(pvVar33,pvVar29,0x23c);
                  goto LAB_001bcf2d;
                }
              }
            }
            this_03 = &this->blocks;
            std::array<ruckig::Block,_1UL>::operator[](this_03,(size_type)dStack_1f10);
            std::abs((int)this_03);
            if (4.440892098500626e-16 <= extraout_XMM0_Qa_01) {
              pvVar29 = std::array<ruckig::Block,_1UL>::operator[]
                                  (&this->blocks,(size_type)dStack_1f10);
              bVar15 = std::optional::operator_cast_to_bool((optional *)&pvVar29->a);
              if (bVar15) {
                pvVar29 = std::array<ruckig::Block,_1UL>::operator[]
                                    (&this->blocks,(size_type)dStack_1f10);
                poVar40 = &pvVar29->a;
                std::optional<ruckig::Block::Interval>::operator->(poVar40);
                std::abs((int)poVar40);
                if (extraout_XMM0_Qa_02 < 4.440892098500626e-16) {
                  pvVar29 = std::array<ruckig::Block,_1UL>::operator[]
                                      (&this->blocks,(size_type)dStack_1f10);
                  pIVar38 = std::optional<ruckig::Block::Interval>::operator->(&pvVar29->a);
                  memcpy(pvVar33,pIVar38 + 0x10,0x23c);
                  goto LAB_001bcf2d;
                }
              }
              pvVar29 = std::array<ruckig::Block,_1UL>::operator[]
                                  (&this->blocks,(size_type)dStack_1f10);
              bVar15 = std::optional::operator_cast_to_bool((optional *)&pvVar29->b);
              if (bVar15) {
                pvVar29 = std::array<ruckig::Block,_1UL>::operator[]
                                    (&this->blocks,(size_type)dStack_1f10);
                poVar40 = &pvVar29->b;
                std::optional<ruckig::Block::Interval>::operator->(poVar40);
                std::abs((int)poVar40);
                if (extraout_XMM0_Qa_03 < 4.440892098500626e-16) {
                  pvVar29 = std::array<ruckig::Block,_1UL>::operator[]
                                      (&this->blocks,(size_type)dStack_1f10);
                  pIVar38 = std::optional<ruckig::Block::Interval>::operator->(&pvVar29->b);
                  memcpy(pvVar33,pIVar38 + 0x10,0x23c);
                  goto LAB_001bcf2d;
                }
              }
              local_1f29 = 0;
              pvVar23 = std::array<ruckig::ControlInterface,_1UL>::operator[]
                                  (&this->inp_per_dof_control_interface,(size_type)dStack_1f10);
              if (*pvVar23 == Position) {
                pvVar19 = std::array<double,_1UL>::operator[](&inp->max_jerk,(size_type)dStack_1f10)
                ;
                uVar17 = std::isinf(*pvVar19);
                if ((uVar17 & 1) == 0) {
                  pvVar27 = std::array<double,_8UL>::operator[](&pvVar33->p,0);
                  dVar6 = *pvVar27;
                  pvVar27 = std::array<double,_8UL>::operator[](&pvVar33->v,0);
                  dVar7 = *pvVar27;
                  pvVar27 = std::array<double,_8UL>::operator[](&pvVar33->a,0);
                  dVar8 = *pvVar27;
                  dVar9 = pvVar33->pf;
                  dVar10 = pvVar33->vf;
                  dVar2 = pvVar33->af;
                  pvVar19 = std::array<double,_1UL>::operator[]
                                      (&inp->max_velocity,(size_type)dStack_1f10);
                  dVar3 = *pvVar19;
                  pvVar20 = std::array<double,_1UL>::operator[]
                                      (&this->inp_min_velocity,(size_type)dStack_1f10);
                  dVar4 = *pvVar20;
                  pvVar19 = std::array<double,_1UL>::operator[]
                                      (&inp->max_acceleration,(size_type)dStack_1f10);
                  dVar5 = *pvVar19;
                  pvVar20 = std::array<double,_1UL>::operator[]
                                      (&this->inp_min_acceleration,(size_type)dStack_1f10);
                  dVar12 = *pvVar20;
                  pvVar19 = std::array<double,_1UL>::operator[]
                                      (&inp->max_jerk,(size_type)dStack_1f10);
                  ruckig::PositionThirdOrderStep2::PositionThirdOrderStep2
                            ((PositionThirdOrderStep2 *)local_2040,dVar41,dVar6,dVar7,dVar8,dVar9,
                             dVar10,dVar2,dVar3,dVar4,dVar5,dVar12,*pvVar19);
                  local_1f29 = ruckig::PositionThirdOrderStep2::get_profile((Profile *)local_2040);
                }
                else {
                  pvVar19 = std::array<double,_1UL>::operator[]
                                      (&inp->max_acceleration,(size_type)dStack_1f10);
                  uVar17 = std::isinf(*pvVar19);
                  if ((uVar17 & 1) == 0) {
                    pvVar27 = std::array<double,_8UL>::operator[](&pvVar33->p,0);
                    dVar6 = *pvVar27;
                    pvVar27 = std::array<double,_8UL>::operator[](&pvVar33->v,0);
                    dVar7 = *pvVar27;
                    dVar8 = pvVar33->pf;
                    dVar9 = pvVar33->vf;
                    pvVar19 = std::array<double,_1UL>::operator[]
                                        (&inp->max_velocity,(size_type)dStack_1f10);
                    dVar10 = *pvVar19;
                    pvVar20 = std::array<double,_1UL>::operator[]
                                        (&this->inp_min_velocity,(size_type)dStack_1f10);
                    dVar2 = *pvVar20;
                    pvVar19 = std::array<double,_1UL>::operator[]
                                        (&inp->max_acceleration,(size_type)dStack_1f10);
                    dVar3 = *pvVar19;
                    pvVar20 = std::array<double,_1UL>::operator[]
                                        (&this->inp_min_acceleration,(size_type)dStack_1f10);
                    ruckig::PositionSecondOrderStep2::PositionSecondOrderStep2
                              ((PositionSecondOrderStep2 *)local_2088,dVar41,dVar6,dVar7,dVar8,dVar9
                               ,dVar10,dVar2,dVar3,*pvVar20);
                    local_1f29 = ruckig::PositionSecondOrderStep2::get_profile
                                           ((Profile *)local_2088);
                  }
                  else {
                    pvVar27 = std::array<double,_8UL>::operator[](&pvVar33->p,0);
                    dVar6 = *pvVar27;
                    dVar7 = pvVar33->pf;
                    pvVar19 = std::array<double,_1UL>::operator[]
                                        (&inp->max_velocity,(size_type)dStack_1f10);
                    dVar8 = *pvVar19;
                    pvVar20 = std::array<double,_1UL>::operator[]
                                        (&this->inp_min_velocity,(size_type)dStack_1f10);
                    ruckig::PositionFirstOrderStep2::PositionFirstOrderStep2
                              ((PositionFirstOrderStep2 *)local_20a8,dVar41,dVar6,dVar7,dVar8,
                               *pvVar20);
                    local_1f29 = ruckig::PositionFirstOrderStep2::get_profile((Profile *)local_20a8)
                    ;
                  }
                }
                local_1f29 = local_1f29 & 1;
              }
              else if (*pvVar23 == Velocity) {
                pvVar19 = std::array<double,_1UL>::operator[](&inp->max_jerk,(size_type)dStack_1f10)
                ;
                uVar17 = std::isinf(*pvVar19);
                if ((uVar17 & 1) == 0) {
                  pvVar27 = std::array<double,_8UL>::operator[](&pvVar33->v,0);
                  dVar6 = *pvVar27;
                  pvVar27 = std::array<double,_8UL>::operator[](&pvVar33->a,0);
                  dVar7 = *pvVar27;
                  dVar8 = pvVar33->vf;
                  dVar9 = pvVar33->af;
                  pvVar19 = std::array<double,_1UL>::operator[]
                                      (&inp->max_acceleration,(size_type)dStack_1f10);
                  dVar10 = *pvVar19;
                  pvVar20 = std::array<double,_1UL>::operator[]
                                      (&this->inp_min_acceleration,(size_type)dStack_1f10);
                  dVar2 = *pvVar20;
                  pvVar19 = std::array<double,_1UL>::operator[]
                                      (&inp->max_jerk,(size_type)dStack_1f10);
                  ruckig::VelocityThirdOrderStep2::VelocityThirdOrderStep2
                            ((VelocityThirdOrderStep2 *)local_20e8,dVar41,dVar6,dVar7,dVar8,dVar9,
                             dVar10,dVar2,*pvVar19);
                  local_1f29 = ruckig::VelocityThirdOrderStep2::get_profile((Profile *)local_20e8);
                }
                else {
                  pvVar27 = std::array<double,_8UL>::operator[](&pvVar33->v,0);
                  dVar6 = *pvVar27;
                  dVar7 = pvVar33->vf;
                  pvVar19 = std::array<double,_1UL>::operator[]
                                      (&inp->max_acceleration,(size_type)dStack_1f10);
                  dVar8 = *pvVar19;
                  pvVar20 = std::array<double,_1UL>::operator[]
                                      (&this->inp_min_acceleration,(size_type)dStack_1f10);
                  ruckig::VelocitySecondOrderStep2::VelocitySecondOrderStep2
                            ((VelocitySecondOrderStep2 *)local_2108,dVar41,dVar6,dVar7,dVar8,
                             *pvVar20);
                  local_1f29 = ruckig::VelocitySecondOrderStep2::get_profile((Profile *)local_2108);
                }
                local_1f29 = local_1f29 & 1;
              }
              if (local_1f29 == 0) {
                pRVar32 = (RuckigError *)__cxa_allocate_exception(0x10);
                std::__cxx11::to_string(&local_21c8,(unsigned_long)dStack_1f10);
                std::operator+(&local_21a8,"error in step 2 in dof: ",&local_21c8);
                std::operator+(&local_2188,&local_21a8," for t sync: ");
                std::__cxx11::to_string(&local_21e8,traj->duration);
                std::operator+(&local_2168,&local_2188,&local_21e8);
                std::operator+(&local_2148,&local_2168," input: ");
                InputParameter<1ul,ruckig::StandardVector>::to_string_abi_cxx11_(&local_2208,inp);
                std::operator+(&local_2128,&local_2148,&local_2208);
                RuckigError::RuckigError(pRVar32,&local_2128);
                __cxa_throw(pRVar32,&RuckigError::typeinfo,RuckigError::~RuckigError);
              }
            }
            else {
              pvVar29 = std::array<ruckig::Block,_1UL>::operator[]
                                  (&this->blocks,(size_type)dStack_1f10);
              memcpy(pvVar33,pvVar29,0x23c);
            }
          }
LAB_001bcf2d:
        }
        this_local._4_4_ = Working;
      }
      else {
        for (local_1ed0 = 0.0; (ulong)local_1ed0 < this->degrees_of_freedom;
            local_1ed0 = (double)((long)local_1ed0 + 1)) {
          pvVar29 = std::array<ruckig::Block,_1UL>::operator[](&this->blocks,(size_type)local_1ed0);
          pvVar18 = std::
                    vector<std::array<ruckig::Profile,_1UL>,_std::allocator<std::array<ruckig::Profile,_1UL>_>_>
                    ::operator[](&traj->profiles,0);
          pvVar33 = std::array<ruckig::Profile,_1UL>::operator[](pvVar18,(size_type)local_1ed0);
          memcpy(pvVar33,pvVar29,0x23c);
        }
        this_local._4_4_ = Working;
      }
    }
    else {
      this_local._4_4_ = ErrorTrajectoryDuration;
    }
  }
  else {
    pvVar29 = std::array<ruckig::Block,_1UL>::operator[](&this->blocks,0);
    traj->duration = pvVar29->t_min;
    pvVar29 = std::array<ruckig::Block,_1UL>::operator[](&this->blocks,0);
    pvVar18 = std::
              vector<std::array<ruckig::Profile,_1UL>,_std::allocator<std::array<ruckig::Profile,_1UL>_>_>
              ::operator[](&traj->profiles,0);
    pvVar33 = std::array<ruckig::Profile,_1UL>::operator[](pvVar18,0);
    memcpy(pvVar33,pvVar29,0x23c);
    vVar11 = traj->duration;
    pvVar34 = std::vector<double,_std::allocator<double>_>::operator[](&traj->cumulative_times,0);
    *pvVar34 = vVar11;
    this_local._4_4_ = Working;
  }
  return this_local._4_4_;
}

Assistant:

Result calculate(const InputParameter<DOFs, CustomVector>& inp, Trajectory<DOFs, CustomVector>& traj, double delta_time, bool& was_interrupted) {
        was_interrupted = false;
#if defined WITH_CLOUD_CLIENT
        traj.resize(0);
#endif

        for (size_t dof = 0; dof < degrees_of_freedom; ++dof) {
            auto& p = traj.profiles[0][dof];

            inp_min_velocity[dof] = inp.min_velocity ? inp.min_velocity.value()[dof] : -inp.max_velocity[dof];
            inp_min_acceleration[dof] = inp.min_acceleration ? inp.min_acceleration.value()[dof] : -inp.max_acceleration[dof];
            inp_per_dof_control_interface[dof] = inp.per_dof_control_interface ? inp.per_dof_control_interface.value()[dof] : inp.control_interface;
            inp_per_dof_synchronization[dof] = inp.per_dof_synchronization ? inp.per_dof_synchronization.value()[dof] : inp.synchronization;

            if (!inp.enabled[dof]) {
                p.p.back() = inp.current_position[dof];
                p.v.back() = inp.current_velocity[dof];
                p.a.back() = inp.current_acceleration[dof];
                p.t_sum.back() = 0.0;
                blocks[dof].t_min = 0.0;
                blocks[dof].a = std::nullopt;
                blocks[dof].b = std::nullopt;
                continue;
            }

            // Calculate brake (if input exceeds or will exceed limits)
            switch (inp_per_dof_control_interface[dof]) {
                case ControlInterface::Position: {
                    if (!std::isinf(inp.max_jerk[dof])) {
                        p.brake.get_position_brake_trajectory(inp.current_velocity[dof], inp.current_acceleration[dof], inp.max_velocity[dof], inp_min_velocity[dof], inp.max_acceleration[dof], inp_min_acceleration[dof], inp.max_jerk[dof]);
                        // p.accel.get_position_brake_trajectory(inp.target_velocity[dof], inp.target_acceleration[dof], inp.max_velocity[dof], inp_min_velocity[dof], inp.max_acceleration[dof], inp_min_acceleration[dof], inp.max_jerk[dof]);
                    } else if (!std::isinf(inp.max_acceleration[dof])) {
                        p.brake.get_second_order_position_brake_trajectory(inp.current_velocity[dof], inp.max_velocity[dof], inp_min_velocity[dof], inp.max_acceleration[dof], inp_min_acceleration[dof]);
                        // p.accel.get_second_order_position_brake_trajectory(inp.target_velocity[dof], inp.target_acceleration[dof], inp.max_velocity[dof], inp_min_velocity[dof], inp.max_acceleration[dof], inp_min_acceleration[dof]);
                    }
                    p.set_boundary(inp.current_position[dof], inp.current_velocity[dof], inp.current_acceleration[dof], inp.target_position[dof], inp.target_velocity[dof], inp.target_acceleration[dof]);
                } break;
                case ControlInterface::Velocity: {
                    if (!std::isinf(inp.max_jerk[dof])) {
                        p.brake.get_velocity_brake_trajectory(inp.current_acceleration[dof], inp.max_acceleration[dof], inp_min_acceleration[dof], inp.max_jerk[dof]);
                        // p.accel.get_velocity_brake_trajectory(inp.target_acceleration[dof], inp.max_acceleration[dof], inp_min_acceleration[dof], inp.max_jerk[dof]);
                    } else {
                        p.brake.get_second_order_velocity_brake_trajectory();
                        // p.accel.get_second_order_velocity_brake_trajectory();
                    }
                    p.set_boundary_for_velocity(inp.current_position[dof], inp.current_velocity[dof], inp.current_acceleration[dof], inp.target_velocity[dof], inp.target_acceleration[dof]);
                } break;
            }

            // Finalize pre & post-trajectories
            if (!std::isinf(inp.max_jerk[dof])) {
                p.brake.finalize(p.p[0], p.v[0], p.a[0]);
                // p.accel.finalize(p.pf, p.vf, p.af);
            } else if (!std::isinf(inp.max_acceleration[dof])) {
                p.brake.finalize_second_order(p.p[0], p.v[0], p.a[0]);
                // p.accel.finalize_second_order(p.pf, p.vf, p.af);
            }

            bool found_profile {false};
            switch (inp_per_dof_control_interface[dof]) {
                case ControlInterface::Position: {
                    if (!std::isinf(inp.max_jerk[dof])) {
                        PositionThirdOrderStep1 step1 {p.p[0], p.v[0], p.a[0], p.pf, p.vf, p.af, inp.max_velocity[dof], inp_min_velocity[dof], inp.max_acceleration[dof], inp_min_acceleration[dof], inp.max_jerk[dof]};
                        found_profile = step1.get_profile(p, blocks[dof]);
                    } else if (!std::isinf(inp.max_acceleration[dof])) {
                        PositionSecondOrderStep1 step1 {p.p[0], p.v[0], p.pf, p.vf, inp.max_velocity[dof], inp_min_velocity[dof], inp.max_acceleration[dof], inp_min_acceleration[dof]};
                        found_profile = step1.get_profile(p, blocks[dof]);
                    } else {
                        PositionFirstOrderStep1 step1 {p.p[0], p.pf, inp.max_velocity[dof], inp_min_velocity[dof]};
                        found_profile = step1.get_profile(p, blocks[dof]);
                    }
                } break;
                case ControlInterface::Velocity: {
                    if (!std::isinf(inp.max_jerk[dof])) {
                        VelocityThirdOrderStep1 step1 {p.v[0], p.a[0], p.vf, p.af, inp.max_acceleration[dof], inp_min_acceleration[dof], inp.max_jerk[dof]};
                        found_profile = step1.get_profile(p, blocks[dof]);
                    } else {
                        VelocitySecondOrderStep1 step1 {p.v[0], p.vf, inp.max_acceleration[dof], inp_min_acceleration[dof]};
                        found_profile = step1.get_profile(p, blocks[dof]);
                    }
                } break;
            }

            if (!found_profile) {
                const bool has_zero_limits = (inp.max_acceleration[dof] == 0.0 || inp_min_acceleration[dof] == 0.0 || inp.max_jerk[dof] == 0.0);
                if (has_zero_limits) {
                    if constexpr (throw_error) {
                        throw RuckigError("zero limits conflict in step 1, dof: " + std::to_string(dof) + " input: " + inp.to_string());
                    } else {
                        return Result::ErrorZeroLimits;
                    }

                } else {
                    if constexpr (throw_error) {
                        throw RuckigError("error in step 1, dof: " + std::to_string(dof) + " input: " + inp.to_string());
                    } else {
                        return Result::ErrorExecutionTimeCalculation;
                    }
                }
            }

            traj.independent_min_durations[dof] = blocks[dof].t_min;
            // std::cout << dof << " profile step1: " << blocks[dof].to_string() << std::endl;
        }

        const bool discrete_duration = (inp.duration_discretization == DurationDiscretization::Discrete);
        if (degrees_of_freedom == 1 && !inp.minimum_duration && !discrete_duration) {
            traj.duration = blocks[0].t_min;
            traj.profiles[0][0] = blocks[0].p_min;
            traj.cumulative_times[0] = traj.duration;
            return Result::Working;
        }

        std::optional<size_t> limiting_dof; // The DoF that doesn't need step 2
        const bool found_synchronization = synchronize(inp.minimum_duration, traj.duration, limiting_dof, traj.profiles[0], discrete_duration, delta_time);
        if (!found_synchronization) {
            bool has_zero_limits = false;
            for (size_t dof = 0; dof < degrees_of_freedom; ++dof) {
                if (inp.max_acceleration[dof] == 0.0 || inp_min_acceleration[dof] == 0.0 || inp.max_jerk[dof] == 0.0) {
                    has_zero_limits = true;
                    break;
                }
            }

            if (has_zero_limits) {
                if constexpr (throw_error) {
                    throw RuckigError("zero limits conflict with other degrees of freedom in time synchronization " + std::to_string(traj.duration));
                } else {
                    return Result::ErrorZeroLimits;
                }

            } else {
                if constexpr (throw_error) {
                    throw RuckigError("error in time synchronization: " + std::to_string(traj.duration));
                } else {
                    return Result::ErrorSynchronizationCalculation;
                }
            }
        }

        // None Synchronization
        for (size_t dof = 0; dof < degrees_of_freedom; ++dof) {
            if (inp.enabled[dof] && inp_per_dof_synchronization[dof] == Synchronization::None) {
                traj.profiles[0][dof] = blocks[dof].p_min;
                if (blocks[dof].t_min > traj.duration) {
                    traj.duration = blocks[dof].t_min;
                    limiting_dof = dof;
                }
            }
        }
        traj.cumulative_times[0] = traj.duration;

        if constexpr (return_error_at_maximal_duration) {
            if (traj.duration > 7.6e3) {
                return Result::ErrorTrajectoryDuration;
            }
        }

        if (traj.duration == 0.0) {
            // Copy all profiles for end state
            for (size_t dof = 0; dof < degrees_of_freedom; ++dof) {
                traj.profiles[0][dof] = blocks[dof].p_min;
            }
            return Result::Working;
        }

        if (!discrete_duration && std::all_of(inp_per_dof_synchronization.begin(), inp_per_dof_synchronization.end(), [](Synchronization s){ return s == Synchronization::None; })) {
            return Result::Working;
        }

        // Phase Synchronization
        if (limiting_dof && std::any_of(inp_per_dof_synchronization.begin(), inp_per_dof_synchronization.end(), [](Synchronization s){ return s == Synchronization::Phase; })) {
            const Profile& p_limiting = traj.profiles[0][limiting_dof.value()];
            if (is_input_collinear(inp, p_limiting.direction, limiting_dof.value())) {
                bool found_time_synchronization {true};
                for (size_t dof = 0; dof < degrees_of_freedom; ++dof) {
                    if (!inp.enabled[dof] || dof == limiting_dof || inp_per_dof_synchronization[dof] != Synchronization::Phase) {
                        continue;
                    }

                    Profile& p = traj.profiles[0][dof];
                    const double t_profile = traj.duration - p.brake.duration - p.accel.duration;

                    p.t = p_limiting.t; // Copy timing information from limiting DoF
                    p.control_signs = p_limiting.control_signs;

                    // Profile::ReachedLimits::NONE is a small hack, as there is no specialization for that in the check function
                    switch (inp_per_dof_control_interface[dof]) {
                        case ControlInterface::Position: {
                            switch (p.control_signs) {
                                case Profile::ControlSigns::UDDU: {
                                    if (!std::isinf(inp.max_jerk[dof])) {
                                        found_time_synchronization &= p.check_with_timing<Profile::ControlSigns::UDDU, Profile::ReachedLimits::NONE>(t_profile, new_phase_control[dof], inp.max_velocity[dof], inp_min_velocity[dof], inp.max_acceleration[dof], inp_min_acceleration[dof], inp.max_jerk[dof]);
                                    } else if (!std::isinf(inp.max_acceleration[dof])) {
                                        found_time_synchronization &= p.check_for_second_order_with_timing<Profile::ControlSigns::UDDU, Profile::ReachedLimits::NONE>(t_profile, new_phase_control[dof], -new_phase_control[dof], inp.max_velocity[dof], inp_min_velocity[dof], inp.max_acceleration[dof], inp_min_acceleration[dof]);
                                    } else {
                                        found_time_synchronization &= p.check_for_first_order_with_timing<Profile::ControlSigns::UDDU, Profile::ReachedLimits::NONE>(t_profile, new_phase_control[dof], inp.max_velocity[dof], inp_min_velocity[dof]);
                                    }
                                } break;
                                case Profile::ControlSigns::UDUD: {
                                    if (!std::isinf(inp.max_jerk[dof])) {
                                        found_time_synchronization &= p.check_with_timing<Profile::ControlSigns::UDUD, Profile::ReachedLimits::NONE>(t_profile, new_phase_control[dof], inp.max_velocity[dof], inp_min_velocity[dof], inp.max_acceleration[dof], inp_min_acceleration[dof], inp.max_jerk[dof]);
                                    } else {
                                        found_time_synchronization &= p.check_for_second_order_with_timing<Profile::ControlSigns::UDUD, Profile::ReachedLimits::NONE>(t_profile, new_phase_control[dof], -new_phase_control[dof], inp.max_velocity[dof], inp_min_velocity[dof], inp.max_acceleration[dof], inp_min_acceleration[dof]);
                                    }
                                } break;
                            }
                        } break;
                        case ControlInterface::Velocity: {
                            switch (p.control_signs) {
                                case Profile::ControlSigns::UDDU: {
                                    if (!std::isinf(inp.max_jerk[dof])) {
                                        found_time_synchronization &= p.check_for_velocity_with_timing<Profile::ControlSigns::UDDU, Profile::ReachedLimits::NONE>(t_profile, new_phase_control[dof], inp.max_acceleration[dof], inp_min_acceleration[dof], inp.max_jerk[dof]);
                                    } else {
                                        found_time_synchronization &= p.check_for_second_order_velocity_with_timing<Profile::ControlSigns::UDDU, Profile::ReachedLimits::NONE>(t_profile, new_phase_control[dof], inp.max_acceleration[dof], inp_min_acceleration[dof]);
                                    }
                                } break;
                                case Profile::ControlSigns::UDUD: {
                                    if (!std::isinf(inp.max_jerk[dof])) {
                                        found_time_synchronization &= p.check_for_velocity_with_timing<Profile::ControlSigns::UDUD, Profile::ReachedLimits::NONE>(t_profile, new_phase_control[dof], inp.max_acceleration[dof], inp_min_acceleration[dof], inp.max_jerk[dof]);
                                    } else {
                                        found_time_synchronization &= p.check_for_second_order_velocity_with_timing<Profile::ControlSigns::UDUD, Profile::ReachedLimits::NONE>(t_profile, new_phase_control[dof], inp.max_acceleration[dof], inp_min_acceleration[dof]);
                                    }
                                } break;
                            }
                        } break;
                    }

                    p.limits = p_limiting.limits; // After check method call to set correct limits
                }

                if (found_time_synchronization && std::all_of(inp_per_dof_synchronization.begin(), inp_per_dof_synchronization.end(), [](Synchronization s){ return s == Synchronization::Phase || s == Synchronization::None; })) {
                    return Result::Working;
                }
            }
        }

        // Time Synchronization
        for (size_t dof = 0; dof < degrees_of_freedom; ++dof) {
            const bool skip_synchronization = (dof == limiting_dof || inp_per_dof_synchronization[dof] == Synchronization::None) && !discrete_duration;
            if (!inp.enabled[dof] || skip_synchronization) {
                continue;
            }

            Profile& p = traj.profiles[0][dof];
            const double t_profile = traj.duration - p.brake.duration - p.accel.duration;

            if (inp_per_dof_synchronization[dof] == Synchronization::TimeIfNecessary && std::abs(inp.target_velocity[dof]) < eps && std::abs(inp.target_acceleration[dof]) < eps) {
                p = blocks[dof].p_min;
                continue;
            }

            // Check if the final time corresponds to an extremal profile calculated in step 1
            // Use 2*eps because of numerical robustness in duration discretization
            if (std::abs(t_profile - blocks[dof].t_min) < 2*eps) {
                p = blocks[dof].p_min;
                continue;
            } else if (blocks[dof].a && std::abs(t_profile - blocks[dof].a->right) < 2*eps) {
                p = blocks[dof].a->profile;
                continue;
            } else if (blocks[dof].b && std::abs(t_profile - blocks[dof].b->right) < 2*eps) {
                p = blocks[dof].b->profile;
                continue;
            }

            bool found_time_synchronization {false};
            switch (inp_per_dof_control_interface[dof]) {
                case ControlInterface::Position: {
                    if (!std::isinf(inp.max_jerk[dof])) {
                        PositionThirdOrderStep2 step2 {t_profile, p.p[0], p.v[0], p.a[0], p.pf, p.vf, p.af, inp.max_velocity[dof], inp_min_velocity[dof], inp.max_acceleration[dof], inp_min_acceleration[dof], inp.max_jerk[dof]};
                        found_time_synchronization = step2.get_profile(p);
                    } else if (!std::isinf(inp.max_acceleration[dof])) {
                        PositionSecondOrderStep2 step2 {t_profile, p.p[0], p.v[0], p.pf, p.vf, inp.max_velocity[dof], inp_min_velocity[dof], inp.max_acceleration[dof], inp_min_acceleration[dof]};
                        found_time_synchronization = step2.get_profile(p);
                    } else {
                        PositionFirstOrderStep2 step2 {t_profile, p.p[0], p.pf, inp.max_velocity[dof], inp_min_velocity[dof]};
                        found_time_synchronization = step2.get_profile(p);
                    }
                } break;
                case ControlInterface::Velocity: {
                    if (!std::isinf(inp.max_jerk[dof])) {
                        VelocityThirdOrderStep2 step2 {t_profile, p.v[0], p.a[0], p.vf, p.af, inp.max_acceleration[dof], inp_min_acceleration[dof], inp.max_jerk[dof]};
                        found_time_synchronization = step2.get_profile(p);
                    } else {
                        VelocitySecondOrderStep2 step2 {t_profile, p.v[0], p.vf, inp.max_acceleration[dof], inp_min_acceleration[dof]};
                        found_time_synchronization = step2.get_profile(p);
                    }
                } break;
            }
            if (!found_time_synchronization) {
                if constexpr (throw_error) {
                    throw RuckigError("error in step 2 in dof: " + std::to_string(dof) + " for t sync: " + std::to_string(traj.duration) + " input: " + inp.to_string());
                } else {
                    return Result::ErrorSynchronizationCalculation;
                }
            }
            // std::cout << dof << " profile step2: " << p.to_string() << std::endl;
        }

        return Result::Working;
    }